

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_transaction.cpp
# Opt level: O3

void __thiscall
TransactionApi_EstimateFee_CheckRealValue_Test::TestBody
          (TransactionApi_EstimateFee_CheckRealValue_Test *this)

{
  ByteData *pBVar1;
  Txid *this_00;
  Txid *this_01;
  pointer pcVar2;
  pointer puVar3;
  bool bVar4;
  uint32_t uVar5;
  char *message;
  _func_int *p_Var6;
  long lVar7;
  Amount AVar8;
  initializer_list<cfd::UtxoData> __l;
  AssertionResult gtest_ar_4;
  TransactionApi api;
  uint32_t minimum_fee;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  Amount tx_fee;
  Amount utxo_fee;
  Amount fee;
  AddressFactory factory;
  TransactionContext txc;
  AssertionResult gtest_ar;
  Address address;
  UtxoData utxo3;
  Address address2;
  UtxoData utxo2;
  UtxoData utxo1;
  undefined1 local_22c8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_22c0;
  undefined1 local_22b8 [16];
  Privkey local_22a8;
  TransactionApi local_2279;
  ByteData local_2278;
  string local_2260;
  Pubkey local_2240;
  Amount local_2228;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2218;
  Amount local_2200;
  Amount local_21f0;
  Amount local_21e0;
  SigHashType local_21cc;
  SigHashType local_21c0;
  SigHashType local_21b4;
  AddressFactory local_21a8;
  TransactionContext local_2180;
  undefined1 local_20c8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_20c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20b8;
  uchar local_20a8 [16];
  pointer local_2098;
  pointer local_2080;
  pointer local_2068;
  TapBranch local_2050;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1fd8;
  Script local_1fc0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f80 [19];
  UtxoData local_1bd8;
  UtxoData local_16e8;
  undefined1 local_11f0 [32];
  undefined1 local_11d0 [16];
  pointer local_11c0;
  pointer local_11a8;
  pointer local_1190;
  TapBranch local_1178;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1100;
  Script local_10e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_10a8;
  UtxoData local_1078;
  Address local_b88;
  UtxoData local_a10;
  UtxoData local_520;
  
  cfd::AddressFactory::AddressFactory(&local_21a8,kRegtest);
  cfd::UtxoData::UtxoData(&local_520);
  local_520.block_height = 0;
  local_520.binary_data = (void *)0x0;
  pBVar1 = &local_a10.block_hash.data_;
  local_a10.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_20c8,(string *)&local_a10);
  this_00 = &local_520.txid;
  cfd::core::Txid::operator=(this_00,(Txid *)local_20c8);
  local_20c8 = (undefined1  [8])&PTR__Txid_00723450;
  if (sStack_20c0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_20c0.ptr_);
  }
  if ((ByteData *)local_a10.block_height != pBVar1) {
    operator_delete((void *)local_a10.block_height);
  }
  local_520.vout = 0;
  local_a10.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac","");
  cfd::core::Script::Script((Script *)local_20c8,(string *)&local_a10);
  cfd::core::Script::operator=(&local_520.locking_script,(Script *)local_20c8);
  cfd::core::Script::~Script((Script *)local_20c8);
  if ((ByteData *)local_a10.block_height != pBVar1) {
    operator_delete((void *)local_a10.block_height);
  }
  local_a10.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW","");
  cfd::AddressFactory::GetAddress((Address *)local_20c8,&local_21a8,(string *)&local_a10);
  cfd::core::Address::operator=(&local_520.address,(Address *)local_20c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1f80);
  cfd::core::Script::~Script(&local_1fc0);
  local_2050._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1fd8)
  ;
  cfd::core::TapBranch::~TapBranch(&local_2050);
  if (local_2068 != (pointer)0x0) {
    operator_delete(local_2068);
  }
  if (local_2080 != (pointer)0x0) {
    operator_delete(local_2080);
  }
  if (local_2098 != (pointer)0x0) {
    operator_delete(local_2098);
  }
  if ((uchar *)local_20b8._M_allocated_capacity != local_20a8) {
    operator_delete((void *)local_20b8._M_allocated_capacity);
  }
  if ((ByteData *)local_a10.block_height != pBVar1) {
    operator_delete((void *)local_a10.block_height);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_520.descriptor,0,(char *)local_520.descriptor._M_string_length,0x57cab2);
  cfd::core::Amount::Amount((Amount *)local_20c8,10000000);
  local_520.amount.ignore_check_ = sStack_20c0.ptr_._0_1_;
  local_520.amount.amount_ = (int64_t)local_20c8;
  local_520.address_type = kP2pkhAddress;
  cfd::UtxoData::UtxoData(&local_a10);
  local_a10.block_height = 0;
  local_a10.binary_data = (void *)0x0;
  pBVar1 = &local_1078.block_hash.data_;
  local_1078.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1078,
             "31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3","");
  cfd::core::Txid::Txid((Txid *)local_20c8,(string *)&local_1078);
  this_01 = &local_a10.txid;
  cfd::core::Txid::operator=(this_01,(Txid *)local_20c8);
  local_20c8 = (undefined1  [8])&PTR__Txid_00723450;
  if (sStack_20c0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_20c0.ptr_);
  }
  if ((ByteData *)local_1078.block_height != pBVar1) {
    operator_delete((void *)local_1078.block_height);
  }
  local_a10.vout = 0;
  local_1078.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1078,"a9145d54db96a28f844a744e393fcd699d6f825b284187","");
  cfd::core::Script::Script((Script *)local_20c8,(string *)&local_1078);
  cfd::core::Script::operator=(&local_a10.locking_script,(Script *)local_20c8);
  cfd::core::Script::~Script((Script *)local_20c8);
  if ((ByteData *)local_1078.block_height != pBVar1) {
    operator_delete((void *)local_1078.block_height);
  }
  local_1078.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1078,"2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16","");
  cfd::AddressFactory::GetAddress((Address *)local_20c8,&local_21a8,(string *)&local_1078);
  cfd::core::Address::operator=(&local_a10.address,(Address *)local_20c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1f80);
  cfd::core::Script::~Script(&local_1fc0);
  local_2050._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1fd8)
  ;
  cfd::core::TapBranch::~TapBranch(&local_2050);
  if (local_2068 != (pointer)0x0) {
    operator_delete(local_2068);
  }
  if (local_2080 != (pointer)0x0) {
    operator_delete(local_2080);
  }
  if (local_2098 != (pointer)0x0) {
    operator_delete(local_2098);
  }
  if ((uchar *)local_20b8._M_allocated_capacity != local_20a8) {
    operator_delete((void *)local_20b8._M_allocated_capacity);
  }
  if ((ByteData *)local_1078.block_height != pBVar1) {
    operator_delete((void *)local_1078.block_height);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_a10.descriptor,0,(char *)local_a10.descriptor._M_string_length,0x542123);
  cfd::core::Amount::Amount((Amount *)local_20c8,180000);
  local_a10.amount.ignore_check_ = sStack_20c0.ptr_._0_1_;
  local_a10.amount.amount_ = (int64_t)local_20c8;
  local_a10.address_type = kP2shP2wpkhAddress;
  cfd::UtxoData::UtxoData(&local_1078);
  local_1078.block_height = 0;
  local_1078.binary_data = (void *)0x0;
  pcVar2 = local_11f0 + 0x10;
  local_11f0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11f0,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_20c8,(string *)local_11f0);
  cfd::core::Txid::operator=(&local_1078.txid,(Txid *)local_20c8);
  local_20c8 = (undefined1  [8])&PTR__Txid_00723450;
  if (sStack_20c0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_20c0.ptr_);
  }
  if ((pointer)local_11f0._0_8_ != pcVar2) {
    operator_delete((void *)local_11f0._0_8_);
  }
  local_1078.vout = 1;
  local_11f0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11f0,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4","");
  cfd::core::Script::Script((Script *)local_20c8,(string *)local_11f0);
  cfd::core::Script::operator=(&local_1078.locking_script,(Script *)local_20c8);
  cfd::core::Script::~Script((Script *)local_20c8);
  if ((pointer)local_11f0._0_8_ != pcVar2) {
    operator_delete((void *)local_11f0._0_8_);
  }
  local_11f0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11f0,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w","");
  cfd::AddressFactory::GetAddress((Address *)local_20c8,&local_21a8,(string *)local_11f0);
  cfd::core::Address::operator=(&local_1078.address,(Address *)local_20c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1f80);
  cfd::core::Script::~Script(&local_1fc0);
  local_2050._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1fd8)
  ;
  cfd::core::TapBranch::~TapBranch(&local_2050);
  if (local_2068 != (pointer)0x0) {
    operator_delete(local_2068);
  }
  if (local_2080 != (pointer)0x0) {
    operator_delete(local_2080);
  }
  if (local_2098 != (pointer)0x0) {
    operator_delete(local_2098);
  }
  if ((uchar *)local_20b8._M_allocated_capacity != local_20a8) {
    operator_delete((void *)local_20b8._M_allocated_capacity);
  }
  if ((pointer)local_11f0._0_8_ != pcVar2) {
    operator_delete((void *)local_11f0._0_8_);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_1078.descriptor,0,(char *)local_1078.descriptor._M_string_length,0x57cab1
            );
  cfd::core::Amount::Amount((Amount *)local_20c8,10000000);
  local_1078.amount.ignore_check_ = sStack_20c0.ptr_._0_1_;
  local_1078.amount.amount_ = (int64_t)local_20c8;
  local_1078.address_type = kP2wpkhAddress;
  local_20c8 = (undefined1  [8])&local_20b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c8,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo","");
  cfd::core::Address::Address((Address *)local_11f0,(string *)local_20c8);
  if (local_20c8 != (undefined1  [8])&local_20b8) {
    operator_delete((void *)local_20c8);
  }
  local_20c8 = (undefined1  [8])&local_20b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c8,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu","");
  cfd::core::Address::Address(&local_b88,(string *)local_20c8);
  if (local_20c8 != (undefined1  [8])&local_20b8) {
    operator_delete((void *)local_20c8);
  }
  cfd::core::Amount::Amount(&local_21e0,10000);
  cfd::TransactionContext::TransactionContext(&local_2180,2,0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::TransactionContext::AddInput(&local_2180,&local_520);
    }
  }
  else {
    testing::Message::Message((Message *)local_20c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_22c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x5b,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_22c8,(Message *)local_20c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_22c8);
    if (local_20c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_20c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_20c8 + 8))();
      }
    }
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)local_20c8,this_01,local_a10.vout);
  cfd::TransactionContext::AddTxIn(&local_2180,(OutPoint *)local_20c8);
  local_20c8 = (undefined1  [8])&PTR__Txid_00723450;
  if (sStack_20c0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_20c0.ptr_);
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)local_20c8,&local_1078.txid,local_1078.vout);
  cfd::TransactionContext::AddTxIn(&local_2180,(OutPoint *)local_20c8);
  local_20c8 = (undefined1  [8])&PTR__Txid_00723450;
  if (sStack_20c0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_20c0.ptr_);
  }
  AVar8 = cfd::core::operator+(&local_520.amount,&local_1078.amount);
  local_22c8 = (undefined1  [8])AVar8.amount_;
  local_22c0.ptr_._0_1_ = AVar8.ignore_check_;
  AVar8 = cfd::core::operator-((Amount *)local_22c8,&local_21e0);
  local_20c8 = (undefined1  [8])AVar8.amount_;
  sStack_20c0.ptr_._0_1_ = AVar8.ignore_check_;
  cfd::TransactionContext::AddTxOut(&local_2180,(Address *)local_11f0,(Amount *)local_20c8);
  cfd::TransactionContext::AddTxOut(&local_2180,&local_b88,&local_a10.amount);
  cfd::UtxoData::UtxoData((UtxoData *)local_20c8,&local_520);
  cfd::UtxoData::UtxoData(&local_1bd8,&local_a10);
  cfd::UtxoData::UtxoData(&local_16e8,&local_1078);
  __l._M_len = 3;
  __l._M_array = (iterator)local_20c8;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_2218,__l,(allocator_type *)local_22c8);
  lVar7 = 0x9e0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_20c8 + lVar7));
    lVar7 = lVar7 + -0x4f0;
  } while (lVar7 != -0x4f0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::TransactionContext::CollectInputUtxo(&local_2180,&local_2218);
    }
  }
  else {
    testing::Message::Message((Message *)local_20c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_22c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x62,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_22c8,(Message *)local_20c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_22c8);
    if (local_20c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_20c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_20c8 + 8))();
      }
    }
  }
  cfd::core::Amount::Amount(&local_2228);
  cfd::core::Amount::Amount(&local_21f0);
  cfd::core::Amount::Amount(&local_2200);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_20c8,(AbstractTransaction *)&local_2180);
  AVar8 = cfd::api::TransactionApi::EstimateFee
                    (&local_2279,(string *)local_20c8,&local_2218,&local_2200,&local_21f0,20.0);
  local_2228.amount_ = AVar8.amount_;
  local_2228.ignore_check_ = AVar8.ignore_check_;
  if (local_20c8 != (undefined1  [8])&local_20b8) {
    operator_delete((void *)local_20c8);
  }
  local_22c8 = (undefined1  [8])cfd::core::Amount::GetSatoshiValue(&local_2228);
  local_22a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_22a8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x1e3c);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_20c8,"calc_fee.GetSatoshiValue()","7740",(long *)local_22c8,
             (int *)&local_22a8);
  if (local_20c8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_22c8);
    if (sStack_20c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      p_Var6 = (_func_int *)0x6169ca;
    }
    else {
      p_Var6 = (_func_int *)((sStack_20c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_22a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x6c,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_22a8,(Message *)local_22c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_22a8);
    if (local_22c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_22c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_22c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_20c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_22c8 = (undefined1  [8])cfd::core::Amount::GetSatoshiValue(&local_2200);
  local_22a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_22a8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x604);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_20c8,"tx_fee.GetSatoshiValue()","1540",(long *)local_22c8,
             (int *)&local_22a8);
  if (local_20c8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_22c8);
    if (sStack_20c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      p_Var6 = (_func_int *)0x6169ca;
    }
    else {
      p_Var6 = (_func_int *)((sStack_20c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_22a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x6d,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_22a8,(Message *)local_22c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_22a8);
    if (local_22c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_22c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_22c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_20c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_22c8 = (undefined1  [8])cfd::core::Amount::GetSatoshiValue(&local_21f0);
  local_22a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_22a8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x1838);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_20c8,"utxo_fee.GetSatoshiValue()","6200",(long *)local_22c8,
             (int *)&local_22a8);
  if (local_20c8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_22c8);
    if (sStack_20c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      p_Var6 = (_func_int *)0x6169ca;
    }
    else {
      p_Var6 = (_func_int *)((sStack_20c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_22a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x6e,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_22a8,(Message *)local_22c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_22a8);
    if (local_22c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_22c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_22c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_20c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::ByteData(&local_2278);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_20c8,this_00,local_520.vout);
      local_22c8 = (undefined1  [8])local_22b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_22c8,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2240,(string *)local_22c8);
      local_2260._M_dataplus._M_p = (pointer)&local_2260.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2260,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_22a8,&local_2260,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_21b4);
      cfd::TransactionContext::SignWithKey
                (&local_2180,(OutPoint *)local_20c8,&local_2240,&local_22a8,&local_21b4,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if (local_22a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_22a8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2260._M_dataplus._M_p != &local_2260.field_2) {
        operator_delete(local_2260._M_dataplus._M_p);
      }
      if (local_2240.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2240.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_22c8 != (undefined1  [8])local_22b8) {
        operator_delete((void *)local_22c8);
      }
      local_20c8 = (undefined1  [8])&PTR__Txid_00723450;
      if (sStack_20c0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_20c0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_20c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_22c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x75,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_22c8,(Message *)local_20c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_22c8);
    if (local_20c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_20c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_20c8 + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_20c8,this_00,local_520.vout);
      cfd::TransactionContext::Verify(&local_2180,(OutPoint *)local_20c8);
      local_20c8 = (undefined1  [8])&PTR__Txid_00723450;
      if (sStack_20c0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_20c0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_20c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_22c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x76,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_22c8,(Message *)local_20c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_22c8);
    if (local_20c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_20c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_20c8 + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::TransactionContext::Finalize((ByteData *)local_20c8,&local_2180);
    puVar3 = local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_20c8;
    local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)sStack_20c0.ptr_;
    local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_20b8._M_allocated_capacity;
    local_20c8 = (undefined1  [8])0x0;
    sStack_20c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_20b8._M_allocated_capacity = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(puVar3);
      if (local_20c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_20c8);
      }
    }
  }
  testing::Message::Message((Message *)local_20c8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_22c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
             ,0x77,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_22c8,(Message *)local_20c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_22c8);
  if (local_20c8 != (undefined1  [8])0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && (local_20c8 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_20c8 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_20c8,this_01,local_a10.vout);
      local_22c8 = (undefined1  [8])local_22b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_22c8,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
      cfd::core::Pubkey::Pubkey(&local_2240,(string *)local_22c8);
      local_2260._M_dataplus._M_p = (pointer)&local_2260.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2260,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
      cfd::core::Privkey::FromWif(&local_22a8,&local_2260,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_21c0);
      cfd::TransactionContext::SignWithKey
                (&local_2180,(OutPoint *)local_20c8,&local_2240,&local_22a8,&local_21c0,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if (local_22a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_22a8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2260._M_dataplus._M_p != &local_2260.field_2) {
        operator_delete(local_2260._M_dataplus._M_p);
      }
      if (local_2240.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2240.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_22c8 != (undefined1  [8])local_22b8) {
        operator_delete((void *)local_22c8);
      }
      local_20c8 = (undefined1  [8])&PTR__Txid_00723450;
      if (sStack_20c0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_20c0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_20c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_22c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x7c,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_22c8,(Message *)local_20c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_22c8);
    if (local_20c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_20c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_20c8 + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_20c8,this_01,local_a10.vout);
      cfd::TransactionContext::Verify(&local_2180,(OutPoint *)local_20c8);
      local_20c8 = (undefined1  [8])&PTR__Txid_00723450;
      if (sStack_20c0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_20c0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_20c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_22c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x7d,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_22c8,(Message *)local_20c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_22c8);
    if (local_20c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_20c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_20c8 + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::TransactionContext::Finalize((ByteData *)local_20c8,&local_2180);
    puVar3 = local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_20c8;
    local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)sStack_20c0.ptr_;
    local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_20b8._M_allocated_capacity;
    local_20c8 = (undefined1  [8])0x0;
    sStack_20c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_20b8._M_allocated_capacity = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(puVar3);
      if (local_20c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_20c8);
      }
    }
  }
  testing::Message::Message((Message *)local_20c8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_22c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
             ,0x7e,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_22c8,(Message *)local_20c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_22c8);
  if (local_20c8 != (undefined1  [8])0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && (local_20c8 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_20c8 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_20c8,&local_1078.txid,local_1078.vout);
      local_22c8 = (undefined1  [8])local_22b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_22c8,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2240,(string *)local_22c8);
      local_2260._M_dataplus._M_p = (pointer)&local_2260.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2260,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_22a8,&local_2260,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_21cc);
      cfd::TransactionContext::SignWithKey
                (&local_2180,(OutPoint *)local_20c8,&local_2240,&local_22a8,&local_21cc,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if (local_22a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_22a8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2260._M_dataplus._M_p != &local_2260.field_2) {
        operator_delete(local_2260._M_dataplus._M_p);
      }
      if (local_2240.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2240.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_22c8 != (undefined1  [8])local_22b8) {
        operator_delete((void *)local_22c8);
      }
      local_20c8 = (undefined1  [8])&PTR__Txid_00723450;
      if (sStack_20c0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_20c0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_20c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_22c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x83,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_22c8,(Message *)local_20c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_22c8);
    if (local_20c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_20c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_20c8 + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_20c8,&local_1078.txid,local_1078.vout);
      cfd::TransactionContext::Verify(&local_2180,(OutPoint *)local_20c8);
      local_20c8 = (undefined1  [8])&PTR__Txid_00723450;
      if (sStack_20c0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_20c0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_20c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_22c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x84,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_22c8,(Message *)local_20c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_22c8);
    if (local_20c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_20c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_20c8 + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::TransactionContext::Finalize((ByteData *)local_20c8,&local_2180);
      puVar3 = local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_20c8;
      local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)sStack_20c0.ptr_;
      local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_20b8._M_allocated_capacity;
      local_20c8 = (undefined1  [8])0x0;
      sStack_20c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_20b8._M_allocated_capacity = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar3 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(puVar3);
        if (local_20c8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_20c8);
        }
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_20c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_22c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x86,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_22c8,(Message *)local_20c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_22c8);
    if (local_20c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_20c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_20c8 + 8))();
      }
    }
  }
  AVar8 = cfd::TransactionContext::GetFeeAmount(&local_2180);
  local_22c8 = (undefined1  [8])AVar8.amount_;
  local_22c0.ptr_._0_1_ = AVar8.ignore_check_;
  local_22a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)local_22c8);
  local_2260._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue(&local_21e0);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_20c8,"txc.GetFeeAmount().GetSatoshiValue()","fee.GetSatoshiValue()",
             (long *)&local_22a8,(long *)&local_2260);
  if (local_20c8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_22c8);
    if (sStack_20c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      p_Var6 = (_func_int *)0x6169ca;
    }
    else {
      p_Var6 = (_func_int *)((sStack_20c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_22a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x87,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_22a8,(Message *)local_22c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_22a8);
    if (local_22c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_22c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_22c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_20c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_20c8,&local_2278);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_22c8,"tx.GetHex().c_str()",
             "\"02000000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200710e3ab10644ebe6bc8934899743cb7a3d127411b4db8ffcdd6a75c03c917760220143a55a35926d9d719d1eed902bcf7dbd5f54fe9830ea653d14895a80535a33f01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffff02f0053101000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca000247304402204583781dada5f2173ef1c60e8d1d93df0edec0fb6aaf46f41639b04446dddb7e02200ff89839302e4325c54ef818ce8fd2dfa3d1f2a62a3fc67ddd62d89f2a07078501210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402207e3807d4a520cdd219791a4a7637d37ce6ae172c03292e525d3bf6ea88d356930220713ddd154bf5c7bcb67f2bf44d39a8fba6048cca9af80a0abf13ee61206cb40d01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b00000000\""
             ,(char *)local_20c8,
             "02000000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200710e3ab10644ebe6bc8934899743cb7a3d127411b4db8ffcdd6a75c03c917760220143a55a35926d9d719d1eed902bcf7dbd5f54fe9830ea653d14895a80535a33f01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffff02f0053101000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca000247304402204583781dada5f2173ef1c60e8d1d93df0edec0fb6aaf46f41639b04446dddb7e02200ff89839302e4325c54ef818ce8fd2dfa3d1f2a62a3fc67ddd62d89f2a07078501210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402207e3807d4a520cdd219791a4a7637d37ce6ae172c03292e525d3bf6ea88d356930220713ddd154bf5c7bcb67f2bf44d39a8fba6048cca9af80a0abf13ee61206cb40d01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b00000000"
            );
  if (local_20c8 != (undefined1  [8])&local_20b8) {
    operator_delete((void *)local_20c8);
  }
  if (local_22c8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_20c8);
    if ((undefined8 *)CONCAT71(local_22c0.ptr_._1_7_,local_22c0.ptr_._0_1_) == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)CONCAT71(local_22c0.ptr_._1_7_,local_22c0.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_22a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x88,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_22a8,(Message *)local_20c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_22a8);
    if (local_20c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_20c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_20c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_22c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetVsize(&local_2180.super_Transaction);
  local_22c8._0_4_ = uVar5;
  local_22a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_22a8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x17e);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_20c8,"txc.GetVsize()","382",(uint *)local_22c8,(int *)&local_22a8);
  if (local_20c8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_22c8);
    if (sStack_20c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      p_Var6 = (_func_int *)0x6169ca;
    }
    else {
      p_Var6 = (_func_int *)((sStack_20c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_22a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x89,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_22a8,(Message *)local_22c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_22a8);
    if (local_22c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_22c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_22c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_20c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetVsize(&local_2180.super_Transaction);
  local_2260._M_dataplus._M_p._0_4_ = uVar5 * 0x14;
  local_22c8._0_4_ = 0x1dd8;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_20c8,"minimum_fee","7640",(uint *)&local_2260,(int *)local_22c8);
  if (local_20c8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_22c8);
    if (sStack_20c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      p_Var6 = (_func_int *)0x6169ca;
    }
    else {
      p_Var6 = (_func_int *)((sStack_20c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_22a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x8c,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_22a8,(Message *)local_22c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_22a8);
    if (local_22c8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_22c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_22c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_20c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2278.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_2218);
  cfd::TransactionContext::~TransactionContext(&local_2180);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_b88.format_data_);
  cfd::core::Script::~Script(&local_b88.redeem_script_);
  local_b88.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_b88.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_b88.script_tree_.super_TapBranch);
  if (local_b88.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b88.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b88.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b88.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b88.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b88.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b88.address_._M_dataplus._M_p != &local_b88.address_.field_2) {
    operator_delete(local_b88.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_10a8);
  cfd::core::Script::~Script(&local_10e8);
  local_1178._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1100)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1178);
  if (local_1190 != (pointer)0x0) {
    operator_delete(local_1190);
  }
  if (local_11a8 != (pointer)0x0) {
    operator_delete(local_11a8);
  }
  if (local_11c0 != (pointer)0x0) {
    operator_delete(local_11c0);
  }
  if ((undefined1 *)local_11f0._16_8_ != local_11d0) {
    operator_delete((void *)local_11f0._16_8_);
  }
  cfd::UtxoData::~UtxoData(&local_1078);
  cfd::UtxoData::~UtxoData(&local_a10);
  cfd::UtxoData::~UtxoData(&local_520);
  local_21a8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_21a8.prefix_list_);
  return;
}

Assistant:

TEST(TransactionApi, EstimateFee_CheckRealValue) {
  AddressFactory factory(NetType::kRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2pkhAddress;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{10000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");

  Amount fee(int64_t{10000});
  TransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxIn(OutPoint(utxo3.txid, utxo3.vout));
  txc.AddTxOut(address, utxo1.amount + utxo3.amount - fee);
  txc.AddTxOut(address2, utxo2.amount);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  // check estimateFee
  double effective_fee_rate = 20.0;
  Amount calc_fee;
  Amount utxo_fee;
  Amount tx_fee;
  TransactionApi api;
  calc_fee = api.EstimateFee(
      txc.GetHex(), utxos, &tx_fee, &utxo_fee, effective_fee_rate);
  EXPECT_EQ(calc_fee.GetSatoshiValue(), 7740);
  EXPECT_EQ(tx_fee.GetSatoshiValue(), 1540);
  EXPECT_EQ(utxo_fee.GetSatoshiValue(), 6200);

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200710e3ab10644ebe6bc8934899743cb7a3d127411b4db8ffcdd6a75c03c917760220143a55a35926d9d719d1eed902bcf7dbd5f54fe9830ea653d14895a80535a33f01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffff02f0053101000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca000247304402204583781dada5f2173ef1c60e8d1d93df0edec0fb6aaf46f41639b04446dddb7e02200ff89839302e4325c54ef818ce8fd2dfa3d1f2a62a3fc67ddd62d89f2a07078501210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402207e3807d4a520cdd219791a4a7637d37ce6ae172c03292e525d3bf6ea88d356930220713ddd154bf5c7bcb67f2bf44d39a8fba6048cca9af80a0abf13ee61206cb40d01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b00000000");
  EXPECT_EQ(txc.GetVsize(), 382);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate);
  EXPECT_EQ(minimum_fee, 7640);
}